

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side2_8d_filter(double *p0,double *p1,double *p2,double *q0,double *q1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  
  dVar34 = *p0;
  dVar33 = *p1 - dVar34;
  dVar43 = p0[2];
  dVar16 = p1[2] - dVar43;
  dVar38 = p0[3];
  dVar25 = p1[3] - dVar38;
  dVar5 = p0[4];
  dVar4 = p1[4] - dVar5;
  dVar32 = p0[6];
  dVar30 = p1[6] - dVar32;
  dVar26 = p0[7];
  dVar15 = p1[7] - dVar26;
  dVar40 = ABS(dVar25);
  if (ABS(dVar25) <= ABS(dVar4)) {
    dVar40 = ABS(dVar4);
  }
  dVar29 = ABS(dVar15);
  if (ABS(dVar15) <= dVar40) {
    dVar29 = dVar40;
  }
  dVar40 = ABS(dVar33);
  if (ABS(dVar33) <= dVar29) {
    dVar40 = dVar29;
  }
  dVar29 = ABS(dVar30);
  if (ABS(dVar30) <= dVar40) {
    dVar29 = dVar40;
  }
  dVar40 = ABS(dVar16);
  if (ABS(dVar16) <= dVar29) {
    dVar40 = dVar29;
  }
  dVar29 = p0[1];
  dVar27 = p1[1] - dVar29;
  dVar14 = ABS(dVar27);
  if (ABS(dVar27) <= dVar40) {
    dVar14 = dVar40;
  }
  dVar40 = p0[5];
  dVar35 = p1[5] - dVar40;
  dVar36 = ABS(dVar35);
  if (ABS(dVar35) <= dVar14) {
    dVar36 = dVar14;
  }
  dVar7 = *q0 - dVar34;
  dVar17 = q0[1] - dVar29;
  dVar14 = ABS(dVar17);
  if (ABS(dVar17) <= ABS(dVar7)) {
    dVar14 = ABS(dVar7);
  }
  dVar8 = q0[2] - dVar43;
  dVar23 = ABS(dVar8);
  if (ABS(dVar8) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar18 = q0[3] - dVar38;
  dVar14 = ABS(dVar18);
  if (ABS(dVar18) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar9 = q0[4] - dVar5;
  dVar23 = ABS(dVar9);
  if (ABS(dVar9) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar19 = q0[5] - dVar40;
  dVar14 = ABS(dVar19);
  if (ABS(dVar19) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar10 = q0[6] - dVar32;
  dVar23 = ABS(dVar10);
  if (ABS(dVar10) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar20 = q0[7] - dVar26;
  dVar14 = ABS(dVar20);
  if (ABS(dVar20) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar28 = *q1 - dVar34;
  dVar23 = ABS(dVar28);
  if (ABS(dVar28) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar37 = q1[1] - dVar29;
  dVar14 = ABS(dVar37);
  if (ABS(dVar37) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar11 = q1[2] - dVar43;
  dVar23 = ABS(dVar11);
  if (ABS(dVar11) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar21 = q1[3] - dVar38;
  dVar14 = ABS(dVar21);
  if (ABS(dVar21) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar12 = q1[4] - dVar5;
  dVar23 = ABS(dVar12);
  if (ABS(dVar12) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar22 = q1[5] - dVar40;
  dVar14 = ABS(dVar22);
  if (ABS(dVar22) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar41 = q1[6] - dVar32;
  dVar23 = ABS(dVar41);
  if (ABS(dVar41) <= dVar14) {
    dVar23 = dVar14;
  }
  dVar13 = q1[7] - dVar26;
  dVar14 = ABS(dVar13);
  if (ABS(dVar13) <= dVar23) {
    dVar14 = dVar23;
  }
  dVar23 = dVar36;
  dVar31 = dVar14;
  if ((dVar14 <= dVar36) && (dVar23 = dVar14, dVar14 < dVar36)) {
    dVar31 = dVar36;
  }
  iVar1 = 0;
  iVar3 = 0;
  if ((1.1554293109153009e-147 <= dVar23) && (iVar3 = iVar1, dVar31 <= 1.8707220957835553e+50)) {
    dVar31 = dVar15 * dVar20 +
             dVar30 * dVar10 +
             dVar35 * dVar19 +
             dVar4 * dVar9 + dVar25 * dVar18 + dVar16 * dVar8 + dVar33 * dVar7 + dVar27 * dVar17;
    dVar44 = dVar15 * dVar13 +
             dVar30 * dVar41 +
             dVar35 * dVar22 +
             dVar4 * dVar12 + dVar25 * dVar21 + dVar16 * dVar11 + dVar33 * dVar28 + dVar27 * dVar37;
    dVar31 = dVar31 + dVar31;
    dVar44 = dVar44 + dVar44;
    dVar23 = dVar36 * dVar14 * 1.6667009016668223e-14;
    dVar42 = dVar44 - dVar31;
    iVar1 = 1;
    if ((dVar23 < dVar42) || (iVar1 = -1, dVar42 < -dVar23)) {
      dVar34 = *p2 - dVar34;
      dVar29 = p2[1] - dVar29;
      dVar43 = p2[2] - dVar43;
      dVar38 = p2[3] - dVar38;
      dVar5 = p2[4] - dVar5;
      dVar40 = p2[5] - dVar40;
      dVar32 = p2[6] - dVar32;
      dVar26 = p2[7] - dVar26;
      dVar23 = dVar36;
      if (dVar36 <= dVar14) {
        dVar23 = dVar14;
      }
      dVar6 = ABS(dVar5);
      if (ABS(dVar5) <= dVar14) {
        dVar6 = dVar14;
      }
      dVar14 = ABS(dVar43);
      if (ABS(dVar43) <= dVar6) {
        dVar14 = dVar6;
      }
      dVar6 = ABS(dVar34);
      if (ABS(dVar34) <= dVar14) {
        dVar6 = dVar14;
      }
      dVar14 = ABS(dVar29);
      if (ABS(dVar29) <= dVar6) {
        dVar14 = dVar6;
      }
      dVar6 = ABS(dVar38);
      if (ABS(dVar38) <= dVar14) {
        dVar6 = dVar14;
      }
      dVar14 = ABS(dVar40);
      if (ABS(dVar40) <= dVar6) {
        dVar14 = dVar6;
      }
      dVar6 = ABS(dVar32);
      if (ABS(dVar32) <= dVar14) {
        dVar6 = dVar14;
      }
      dVar14 = ABS(dVar26);
      if (ABS(dVar26) <= dVar6) {
        dVar14 = dVar6;
      }
      dVar6 = dVar14;
      if (dVar14 <= dVar23) {
        dVar6 = dVar23;
      }
      dVar23 = dVar6;
      dVar24 = dVar36;
      if ((dVar36 <= dVar6) && (dVar23 = dVar36, dVar36 < dVar6)) {
        dVar24 = dVar6;
      }
      dVar39 = dVar14;
      if (dVar23 <= dVar14) {
        dVar39 = dVar23;
      }
      if ((1.2641951066311592e-74 <= dVar39) && (dVar24 <= 1.8707220957835553e+50)) {
        dVar4 = dVar15 * dVar15 +
                dVar30 * dVar30 +
                dVar35 * dVar35 +
                dVar4 * dVar4 +
                dVar25 * dVar25 + dVar16 * dVar16 + dVar33 * dVar33 + dVar27 * dVar27;
        dVar15 = dVar36 * dVar14 * dVar14 * dVar6 * 8.711401122557855e-13;
        dVar34 = (dVar13 * dVar26 +
                 dVar41 * dVar32 +
                 dVar22 * dVar40 +
                 dVar12 * dVar5 +
                 dVar21 * dVar38 + dVar11 * dVar43 + dVar28 * dVar34 + dVar37 * dVar29) * -2.0 *
                 (dVar4 - dVar31) +
                 dVar42 * (dVar26 * dVar26 +
                          dVar32 * dVar32 +
                          dVar40 * dVar40 +
                          dVar5 * dVar5 +
                          dVar38 * dVar38 + dVar43 * dVar43 + dVar34 * dVar34 + dVar29 * dVar29) +
                 (dVar20 * dVar26 +
                 dVar10 * dVar32 +
                 dVar19 * dVar40 +
                 dVar9 * dVar5 + dVar18 * dVar38 + dVar8 * dVar43 + dVar7 * dVar34 + dVar17 * dVar29
                 ) * -2.0 * (dVar44 - dVar4);
        iVar2 = 1;
        if ((dVar15 < dVar34) || (iVar2 = -1, dVar34 < -dVar15)) {
          iVar3 = iVar2 * iVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

inline int side2_8d_filter( const double* p0, const double* p1, const double* p2, const double* q0, const double* q1) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double Delta;
    Delta = (a11 - a10);
    double DeltaLambda0;
    DeltaLambda0 = (a11 - l1);
    double DeltaLambda1;
    DeltaLambda1 = (l1 - a10);
    double r;
    r = (((Delta * l2) - (a20 * DeltaLambda0)) - (a21 * DeltaLambda1));
    double eps;
    double max1 = fabs(p1_4_p0_4);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q1_2_p0_2)) )
    {
        max2 = fabs(q1_2_p0_2);
    } 
    if( (max2 < fabs(q1_3_p0_3)) )
    {
        max2 = fabs(q1_3_p0_3);
    } 
    if( (max2 < fabs(q1_4_p0_4)) )
    {
        max2 = fabs(q1_4_p0_4);
    } 
    if( (max2 < fabs(q1_5_p0_5)) )
    {
        max2 = fabs(q1_5_p0_5);
    } 
    if( (max2 < fabs(q1_6_p0_6)) )
    {
        max2 = fabs(q1_6_p0_6);
    } 
    if( (max2 < fabs(q1_7_p0_7)) )
    {
        max2 = fabs(q1_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max3 = max2;
    if( (max3 < max1) )
    {
        max3 = max1;
    } 
    double max4 = max2;
    if( (max4 < fabs(p2_4_p0_4)) )
    {
        max4 = fabs(p2_4_p0_4);
    } 
    if( (max4 < fabs(p2_2_p0_2)) )
    {
        max4 = fabs(p2_2_p0_2);
    } 
    if( (max4 < fabs(p2_0_p0_0)) )
    {
        max4 = fabs(p2_0_p0_0);
    } 
    if( (max4 < fabs(p2_1_p0_1)) )
    {
        max4 = fabs(p2_1_p0_1);
    } 
    if( (max4 < fabs(p2_3_p0_3)) )
    {
        max4 = fabs(p2_3_p0_3);
    } 
    if( (max4 < fabs(p2_5_p0_5)) )
    {
        max4 = fabs(p2_5_p0_5);
    } 
    if( (max4 < fabs(p2_6_p0_6)) )
    {
        max4 = fabs(p2_6_p0_6);
    } 
    if( (max4 < fabs(p2_7_p0_7)) )
    {
        max4 = fabs(p2_7_p0_7);
    } 
    if( (max3 < max4) )
    {
        max3 = max4;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    if( (lower_bound_1 < 1.26419510663115923609e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (8.71140112255785451890e-13 * (((max1 * max4) * max4) * max3));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}